

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StateBlockBuilder.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_67dfd::StateBlockBuilder::defaultRender(StateBlockBuilder *this,ivec2 param_1)

{
  BlockTemplate *this_00;
  Renderer *r;
  char *in_RCX;
  int in_EDX;
  int in_R8D;
  int in_R9D;
  
  App::r(this,(void *)param_1,in_EDX,in_RCX,in_R8D,in_R9D);
  sg_apply_viewport((this->m_layout).m_blockPreview.topLeft.x,
                    (this->m_layout).m_blockPreview.topLeft.y,(this->m_layout).m_blockPreview.size.x
                    ,(this->m_layout).m_blockPreview.size.y,true);
  BasicPit::draw((this->m_physicalData).pit._M_t.
                 super___uniq_ptr_impl<BasicPit,_std::default_delete<BasicPit>_>._M_t.
                 super__Tuple_impl<0UL,_BasicPit_*,_std::default_delete<BasicPit>_>.
                 super__Head_base<0UL,_BasicPit_*,_false>._M_head_impl,r);
  this_00 = (this->m_physicalData).block.
            super___shared_ptr<BlockTemplate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 != (BlockTemplate *)0x0) {
    BlockTemplate::draw(this_00,r,
                        &((this->m_physicalData).pit._M_t.
                          super___uniq_ptr_impl<BasicPit,_std::default_delete<BasicPit>_>._M_t.
                          super__Tuple_impl<0UL,_BasicPit_*,_std::default_delete<BasicPit>_>.
                          super__Head_base<0UL,_BasicPit_*,_false>._M_head_impl)->m_projView);
    return;
  }
  return;
}

Assistant:

void defaultRender(ivec2) override
    {
        auto& r = App::r();
        auto& previewArea = m_layout.blockPreview();
        sg_apply_viewport(previewArea.topLeft.x, previewArea.topLeft.y, previewArea.size.x, previewArea.size.y, true);
        m_physicalData.pit->draw(r);
        if (m_physicalData.block) m_physicalData.block->draw(r, m_physicalData.pit->projView());
    }